

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.hpp
# Opt level: O0

bloom_type __thiscall
bloom_filter::hash_ap(bloom_filter *this,uchar *begin,size_t remaining_length,bloom_type hash)

{
  uint uVar1;
  bool bVar2;
  unsigned_short *i_1;
  uint *i;
  uint *i2;
  uint *i1;
  uint *puStack_30;
  uint loop;
  uchar *itr;
  size_t sStack_20;
  bloom_type hash_local;
  size_t remaining_length_local;
  uchar *begin_local;
  bloom_filter *this_local;
  
  puStack_30 = (uint *)begin;
  itr._4_4_ = hash;
  for (sStack_20 = remaining_length; 7 < sStack_20; sStack_20 = sStack_20 - 8) {
    itr._4_4_ = itr._4_4_ << 7 ^ *puStack_30 * (itr._4_4_ >> 3) ^
                itr._4_4_ * 0x800 + (puStack_30[1] ^ itr._4_4_ >> 5) ^ 0xffffffff ^ itr._4_4_;
    puStack_30 = puStack_30 + 2;
  }
  if (sStack_20 != 0) {
    bVar2 = 3 < sStack_20;
    if (bVar2) {
      itr._4_4_ = itr._4_4_ * 0x800 + (*puStack_30 ^ itr._4_4_ >> 5) ^ 0xffffffff ^ itr._4_4_;
      sStack_20 = sStack_20 - 4;
      puStack_30 = puStack_30 + 1;
    }
    i1._4_4_ = (uint)bVar2;
    if (1 < sStack_20) {
      if (i1._4_4_ == 0) {
        uVar1 = itr._4_4_ * 0x800 + ((uint)(ushort)*puStack_30 ^ itr._4_4_ >> 5) ^ 0xffffffff;
      }
      else {
        uVar1 = itr._4_4_ << 7 ^ (uint)(ushort)*puStack_30 * (itr._4_4_ >> 3);
      }
      itr._4_4_ = uVar1 ^ itr._4_4_;
      i1._4_4_ = i1._4_4_ + 1;
      sStack_20 = sStack_20 - 2;
      puStack_30 = (uint *)((long)puStack_30 + 2);
    }
    if (sStack_20 != 0) {
      itr._4_4_ = ((uint)(byte)*puStack_30 ^ itr._4_4_ * -0x5a5a5a5b) + i1._4_4_ + itr._4_4_;
    }
  }
  return itr._4_4_;
}

Assistant:

inline bloom_type hash_ap(const unsigned char* begin, std::size_t remaining_length, bloom_type hash) const
   {
      const unsigned char* itr = begin;
      unsigned int loop        = 0;

      while (remaining_length >= 8)
      {
         const unsigned int& i1 = *(reinterpret_cast<const unsigned int*>(itr)); itr += sizeof(unsigned int);
         const unsigned int& i2 = *(reinterpret_cast<const unsigned int*>(itr)); itr += sizeof(unsigned int);

         hash ^= (hash <<  7) ^  i1 * (hash >> 3) ^
              (~((hash << 11) + (i2 ^ (hash >> 5))));

         remaining_length -= 8;
      }

      if (remaining_length)
      {
         if (remaining_length >= 4)
         {
            const unsigned int& i = *(reinterpret_cast<const unsigned int*>(itr));

            if (loop & 0x01)
               hash ^=    (hash <<  7) ^  i * (hash >> 3);
            else
               hash ^= (~((hash << 11) + (i ^ (hash >> 5))));

            ++loop;

            remaining_length -= 4;

            itr += sizeof(unsigned int);
         }

         if (remaining_length >= 2)
         {
            const unsigned short& i = *(reinterpret_cast<const unsigned short*>(itr));

            if (loop & 0x01)
               hash ^=    (hash <<  7) ^  i * (hash >> 3);
            else
               hash ^= (~((hash << 11) + (i ^ (hash >> 5))));

            ++loop;

            remaining_length -= 2;

            itr += sizeof(unsigned short);
         }

         if (remaining_length)
         {
            hash += ((*itr) ^ (hash * 0xA5A5A5A5)) + loop;
         }
      }

      return hash;
   }